

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

string * __thiscall
ftxui::Color::Print_abi_cxx11_(string *__return_storage_ptr__,Color *this,bool is_background_color)

{
  char *__s;
  char *local_1a0;
  char *local_188;
  char *local_160;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  allocator<char> local_2d [19];
  allocator<char> local_1a;
  undefined1 local_19;
  Color *pCStack_18;
  bool is_background_color_local;
  Color *this_local;
  
  local_19 = is_background_color;
  pCStack_18 = this;
  this_local = (Color *)__return_storage_ptr__;
  switch(this->type_) {
  case Palette1:
    if (is_background_color) {
      local_160 = "49";
    }
    else {
      local_160 = "39";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_160,&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    break;
  case Palette16:
    __s = *(char **)((anonymous_namespace)::palette16code +
                    (ulong)(is_background_color & 1) * 8 + (ulong)(this->field_1).index_ * 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case Palette256:
    if (is_background_color) {
      local_188 = "48;5;";
    }
    else {
      local_188 = "38;5;";
    }
    std::__cxx11::to_string(&local_50,(uint)(this->field_1).index_);
    std::operator+(__return_storage_ptr__,local_188,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case TrueColor:
    if (is_background_color) {
      local_1a0 = "48;2;";
    }
    else {
      local_1a0 = "38;2;";
    }
    std::__cxx11::to_string(&local_f0,(uint)(this->field_1).index_);
    std::operator+(&local_d0,local_1a0,&local_f0);
    std::operator+(&local_b0,&local_d0,";");
    std::__cxx11::to_string(&local_110,(uint)this->green_);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,";");
    std::__cxx11::to_string(&local_130,(uint)this->blue_);
    std::operator+(__return_storage_ptr__,&local_70,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_131);
    std::allocator<char>::~allocator(&local_131);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::Print(bool is_background_color) const {
  switch (type_) {
    case ColorType::Palette1:
      return is_background_color ? "49" : "39";

    case ColorType::Palette16:
      return palette16code[index_][is_background_color];

    case ColorType::Palette256:
      return (is_background_color ? "48;5;" : "38;5;") + std::to_string(index_);

    case ColorType::TrueColor:
      return (is_background_color ? "48;2;" : "38;2;")  //
             + std::to_string(red_) + ";"               //
             + std::to_string(green_) + ";"             //
             + std::to_string(blue_);                   //
  }
  return "";
}